

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

RecyclableObject * __thiscall
Js::JavascriptLibrary::CreateExternalFunction_TTD(JavascriptLibrary *this,Var fname)

{
  bool bVar1;
  int32 propertyId;
  JavascriptExternalFunction *this_00;
  
  bVar1 = TaggedInt::Is(fname);
  if (bVar1) {
    propertyId = TaggedInt::ToInt32(fname);
    bVar1 = ScriptContext::IsTrackedPropertyId
                      ((this->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
    if (!bVar1) {
      ScriptContext::TrackPid((this->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
    }
  }
  this_00 = CreateIdMappedExternalFunction<void*(*)(void*,void**,unsigned_short,Js::StdCallJavascriptMethodInfo*,void*)>
                      (this,JavascriptExternalFunction::TTDReplayDummyExternalMethod,
                       (this->stdCallFunctionWithDeferredPrototypeType).ptr);
  RuntimeFunction::SetFunctionNameId(&this_00->super_RuntimeFunction,fname);
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this_00->callbackState,(void *)0x0);
  return (RecyclableObject *)this_00;
}

Assistant:

Js::RecyclableObject* JavascriptLibrary::CreateExternalFunction_TTD(Js::Var fname)
    {
        if(TaggedInt::Is(fname))
        {
            PropertyId pid = TaggedInt::ToInt32(fname);
            if(!scriptContext->IsTrackedPropertyId(pid))
            {
                scriptContext->TrackPid(pid);
            }
        }

        JavascriptExternalFunction* function = this->CreateIdMappedExternalFunction(&JavascriptExternalFunction::TTDReplayDummyExternalMethod, stdCallFunctionWithDeferredPrototypeType);
        function->SetFunctionNameId(fname);
        function->SetCallbackState(nullptr);
        return function;
    }